

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtuiohandler.cpp
# Opt level: O3

void __thiscall QTuioHandler::QTuioHandler(QTuioHandler *this,QString *specification)

{
  QUdpSocket *this_00;
  QTuioHandler *this_01;
  int *piVar1;
  bool bVar2;
  QDebug QVar3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  undefined8 *puVar10;
  QTransform *pQVar11;
  QPointingDevice *pQVar12;
  undefined4 *puVar13;
  long lVar14;
  CaseSensitivity CVar15;
  undefined8 *puVar16;
  ImplFn p_Var17;
  QTuioHandler *pQVar18;
  ulong uVar19;
  ulong uVar20;
  long in_FS_OFFSET;
  byte bVar21;
  QByteArrayView QVar22;
  QStringView QVar23;
  QByteArrayView QVar24;
  QStringView QVar25;
  QByteArrayView QVar26;
  QStringView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  int local_124;
  QObject local_f8 [8];
  QDebug local_f0;
  QDebug local_e8;
  storage_type_conflict *psStack_e0;
  qsizetype local_d8;
  QArrayDataPointer<QString> local_c8;
  QString local_a8;
  QString local_88;
  char *local_70;
  long local_38;
  
  bVar21 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::QObject((QObject *)this,(QObject *)0x0);
  *(undefined ***)this = &PTR_metaObject_00114858;
  *(undefined8 *)(this + 0x10) = 0;
  this_00 = (QUdpSocket *)(this + 0x18);
  QUdpSocket::QUdpSocket(this_00,(QObject *)0x0);
  this_01 = this + 0x68;
  *(undefined8 *)(this + 0x58) = 0;
  *(undefined8 *)(this + 0x60) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined8 *)(this + 0x50) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  puVar16 = &DAT_001104e8;
  pQVar18 = this_01;
  for (lVar14 = 9; lVar14 != 0; lVar14 = lVar14 + -1) {
    *(undefined8 *)pQVar18 = *puVar16;
    puVar16 = puVar16 + (ulong)bVar21 * -2 + 1;
    pQVar18 = pQVar18 + (ulong)bVar21 * -0x10 + 8;
  }
  *(ushort *)(this + 0xb0) = *(ushort *)(this + 0xb0) & 0xfc00;
  local_c8.size = 0xaaaaaaaaaaaaaaaa;
  local_c8.d._0_4_ = 0xaaaaaaaa;
  local_c8.d._4_4_ = 0xaaaaaaaa;
  local_c8.ptr._0_4_ = 0xaaaaaaaa;
  local_c8.ptr._4_4_ = 0xaaaaaaaa;
  QString::split(&local_c8,specification,0x3a,0,1);
  if (local_c8.size == 0) {
    uVar19 = 0xd05;
  }
  else {
    uVar19 = 0xd05;
    lVar14 = 0;
    uVar20 = 0;
    local_124 = 0;
    bVar2 = false;
    bVar6 = false;
    do {
      lVar9 = CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_);
      QVar22.m_data = (storage_type *)0x4;
      QVar22.m_size = (qsizetype)&local_88;
      QString::fromUtf8(QVar22);
      local_a8.d.d = (Data *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_);
      local_a8.d.ptr = (char16_t *)CONCAT44(local_88.d.ptr._4_4_,local_88.d.ptr._0_4_);
      local_a8.d.size = CONCAT44(local_88.d.size._4_4_,(undefined4)local_88.d.size);
      CVar15 = (CaseSensitivity)&local_a8;
      cVar4 = QString::startsWith((QString *)(lVar9 + lVar14),CVar15);
      if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (cVar4 == '\0') {
        lVar9 = CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_);
        QVar24.m_data = (storage_type *)0x4;
        QVar24.m_size = (qsizetype)&local_88;
        QString::fromUtf8(QVar24);
        local_a8.d.d = (Data *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_);
        local_a8.d.ptr = (char16_t *)CONCAT44(local_88.d.ptr._4_4_,local_88.d.ptr._0_4_);
        local_a8.d.size = CONCAT44(local_88.d.size._4_4_,(undefined4)local_88.d.size);
        cVar4 = QString::startsWith((QString *)(lVar9 + lVar14),CVar15);
        if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (cVar4 == '\0') {
          bVar5 = comparesEqual((QString *)
                                (CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_) + lVar14),"invertx"
                               );
          if (bVar5) {
            bVar2 = true;
          }
          else {
            bVar5 = comparesEqual((QString *)
                                  (CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_) + lVar14),
                                  "inverty");
            if (bVar5) {
              bVar6 = true;
            }
            else {
              lVar9 = CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_);
              QVar26.m_data = (storage_type *)0x7;
              QVar26.m_size = (qsizetype)&local_88;
              QString::fromUtf8(QVar26);
              local_a8.d.d = (Data *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_);
              local_a8.d.ptr = (char16_t *)CONCAT44(local_88.d.ptr._4_4_,local_88.d.ptr._0_4_);
              local_a8.d.size = CONCAT44(local_88.d.size._4_4_,(undefined4)local_88.d.size);
              cVar4 = QString::startsWith((QString *)(lVar9 + lVar14),CVar15);
              if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (cVar4 != '\0') {
                local_a8.d.size = -0x5555555555555556;
                local_a8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
                local_a8.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
                lVar9 = CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_);
                QString::QString(&local_88,(QChar)0x3d);
                QString::section(&local_a8,lVar9 + lVar14,&local_88,1,1,0);
                piVar1 = (int *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_);
                if (piVar1 != (int *)0x0) {
                  LOCK();
                  *piVar1 = *piVar1 + -1;
                  UNLOCK();
                  if (*piVar1 == 0) {
                    QArrayData::deallocate
                              ((QArrayData *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_),2,0x10)
                    ;
                  }
                }
                QVar27.m_data = local_a8.d.ptr;
                QVar27.m_size = local_a8.d.size;
                lVar9 = QString::toIntegral_helper(QVar27,(bool *)0x0,10);
                iVar7 = (int)lVar9;
                if ((iVar7 == lVar9) && (((iVar7 == 0x5a || (iVar7 == 0x10e)) || (iVar7 == 0xb4))))
                {
                  local_124 = iVar7;
                }
                goto LAB_001087bd;
              }
            }
          }
        }
        else {
          local_d8 = -0x5555555555555556;
          local_e8.stream = (Stream *)0xaaaaaaaaaaaaaaaa;
          psStack_e0 = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
          lVar9 = CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_);
          QString::QString(&local_88,(QChar)0x3d);
          QString::section(&local_e8,lVar9 + lVar14,&local_88,1,1,0);
          piVar1 = (int *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_),2,0x10);
            }
          }
          QVar25.m_data = psStack_e0;
          QVar25.m_size = local_d8;
          uVar8 = QString::toIntegral_helper(QVar25,(bool *)0x0,10);
          uVar19 = uVar8 & 0xffffffff;
          if ((long)(int)uVar8 != uVar8) {
            uVar19 = 0;
          }
          lcTuioHandler();
          if (((byte)lcTuioHandler::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1)
              != 0) {
            local_88.d.d._0_4_ = 2;
            local_88.d.d._4_4_ = 0;
            local_88.d.ptr._0_4_ = 0;
            local_88.d.ptr._4_4_ = 0;
            local_88.d.size._0_4_ = 0;
            local_88.d.size._4_4_ = 0;
            local_70 = lcTuioHandler::category.name;
            QMessageLogger::warning();
            QVar3.stream = local_f0.stream;
            QVar28.m_data = (storage_type *)0x31;
            QVar28.m_size = (qsizetype)&local_a8;
            QString::fromUtf8(QVar28);
            QTextStream::operator<<((QTextStream *)QVar3.stream,&local_a8);
            if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (*(QTextStream *)(local_f0.stream + 0x30) == (QTextStream)0x1) {
              QTextStream::operator<<((QTextStream *)local_f0.stream,' ');
            }
            QTextStream::operator<<((QTextStream *)local_f0.stream,(int)uVar19);
            if (*(QTextStream *)(local_f0.stream + 0x30) == (QTextStream)0x1) {
              QTextStream::operator<<((QTextStream *)local_f0.stream,' ');
            }
            QDebug::~QDebug(&local_f0);
          }
          if ((QArrayData *)local_e8.stream != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_e8.stream = *(int *)local_e8.stream + -1;
            iVar7 = *(int *)local_e8.stream;
            UNLOCK();
            QVar3.stream = local_e8.stream;
            goto joined_r0x00108925;
          }
        }
      }
      else {
        local_a8.d.size = -0x5555555555555556;
        local_a8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_a8.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        lVar9 = CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_);
        QString::QString(&local_88,(QChar)0x3d);
        QString::section(&local_a8,lVar9 + lVar14,&local_88,1,1,0);
        piVar1 = (int *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_),2,0x10);
          }
        }
        QVar23.m_data = local_a8.d.ptr;
        QVar23.m_size = local_a8.d.size;
        uVar8 = QString::toIntegral_helper(QVar23,(bool *)0x0,10);
        uVar19 = uVar8 & 0xffffffff;
        if ((long)(int)uVar8 != uVar8) {
          uVar19 = 0;
        }
LAB_001087bd:
        if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          iVar7 = ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
          UNLOCK();
          QVar3.stream = (Stream *)local_a8.d.d;
joined_r0x00108925:
          if (iVar7 == 0) {
            QArrayData::deallocate((QArrayData *)QVar3.stream,2,0x10);
          }
        }
      }
      uVar20 = uVar20 + 1;
      lVar14 = lVar14 + 0x18;
    } while (uVar20 < (ulong)local_c8.size);
    if (local_124 != 0) {
      QTransform::fromTranslate(0.5,0.5);
      QTransform::rotate((double)local_124,(Axis)&local_88);
      puVar10 = (undefined8 *)QTransform::translate(-0.5,-0.5);
      puVar16 = puVar10;
      pQVar18 = this_01;
      for (lVar14 = 9; lVar14 != 0; lVar14 = lVar14 + -1) {
        *(undefined8 *)pQVar18 = *puVar16;
        puVar16 = puVar16 + (ulong)bVar21 * -2 + 1;
        pQVar18 = pQVar18 + (ulong)bVar21 * -0x10 + 8;
      }
      *(undefined2 *)(this + 0xb0) = *(undefined2 *)(puVar10 + 9);
    }
    if (bVar2) {
      QTransform::fromTranslate(0.5,0.5);
      QTransform::scale(-1.0,1.0);
      pQVar11 = (QTransform *)QTransform::translate(-0.5,-0.5);
      QTransform::operator*=((QTransform *)this_01,pQVar11);
    }
    if (bVar6) {
      QTransform::fromTranslate(0.5,0.5);
      QTransform::scale(1.0,-1.0);
      pQVar11 = (QTransform *)QTransform::translate(-0.5,-0.5);
      QTransform::operator*=((QTransform *)this_01,pQVar11);
    }
  }
  pQVar12 = (QPointingDevice *)operator_new(0x10);
  QVar29.m_data = (storage_type *)0x4;
  QVar29.m_size = (qsizetype)&local_88;
  QString::fromLatin1(QVar29);
  local_a8.d.d = (Data *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_);
  local_a8.d.ptr = (char16_t *)CONCAT44(local_88.d.ptr._4_4_,local_88.d.ptr._0_4_);
  local_a8.d.size = CONCAT44(local_88.d.size._4_4_,(undefined4)local_88.d.size);
  local_88.d.size._0_4_ = 0;
  local_88.d.size._4_4_ = 0;
  local_88.d.d._0_4_ = 0;
  local_88.d.d._4_4_ = 0;
  local_88.d.ptr._0_4_ = 0;
  local_88.d.ptr._4_4_ = 0;
  QPointingDevice::QPointingDevice
            (pQVar12,&local_a8,1,2,2,0x2b,0x10,0,&local_88,0xffffffffffffffff,0);
  *(QPointingDevice **)(this + 0x10) = pQVar12;
  piVar1 = (int *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_),2,0x10);
    }
  }
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  QWindowSystemInterface::registerInputDevice(*(QInputDevice **)(this + 0x10));
  QHostAddress::QHostAddress((QHostAddress *)&local_88,Any);
  cVar4 = (**(code **)(*(long *)(this + 0x18) + 0xf0))
                    (this_00,(QHostAddress *)&local_88,uVar19 & 0xffff,0);
  QHostAddress::~QHostAddress((QHostAddress *)&local_88);
  if (cVar4 == '\0') {
    lcTuioHandler();
    if (((byte)lcTuioHandler::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0)
    {
      local_88.d.d._0_4_ = 2;
      local_88.d.d._4_4_ = 0;
      local_88.d.ptr._0_4_ = 0;
      local_88.d.ptr._4_4_ = 0;
      local_88.d.size._0_4_ = 0;
      local_88.d.size._4_4_ = 0;
      local_70 = lcTuioHandler::category.name;
      QMessageLogger::warning();
      QVar3.stream = local_e8.stream;
      QVar30.m_data = (storage_type *)0x1c;
      QVar30.m_size = (qsizetype)&local_a8;
      QString::fromUtf8(QVar30);
      QTextStream::operator<<((QTextStream *)QVar3.stream,&local_a8);
      if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((char)(((QArrayData *)(local_e8.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_e8.stream,' ');
      }
      QIODevice::errorString();
      p_Var17 = (ImplFn)local_a8.d.ptr;
      if ((ImplFn)local_a8.d.ptr == (ImplFn)0x0) {
        p_Var17 = (ImplFn)&QString::_empty;
      }
      QDebug::putString((QChar *)&local_e8,(ulong)p_Var17);
      if ((char)(((QArrayData *)(local_e8.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_e8.stream,' ');
      }
      if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
        }
      }
      QDebug::~QDebug(&local_e8);
    }
  }
  else {
    local_a8.d.d = (Data *)processPackets;
    local_a8.d.ptr = (char16_t *)0x0;
    local_88.d.d._0_4_ = 0x1161b8;
    local_88.d.d._4_4_ = 0;
    local_88.d.ptr._0_4_ = 0;
    local_88.d.ptr._4_4_ = 0;
    puVar13 = (undefined4 *)operator_new(0x20);
    *puVar13 = 1;
    *(code **)(puVar13 + 2) =
         QtPrivate::QCallableObject<void_(QTuioHandler::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar13 + 4) = processPackets;
    *(undefined8 *)(puVar13 + 6) = 0;
    QObject::connectImpl
              (local_f8,(void **)this_00,(QObject *)&local_88,(void **)this,
               (QSlotObjectBase *)&local_a8,(ConnectionType)puVar13,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_f8);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_c8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QTuioHandler::QTuioHandler(const QString &specification)
{
    QStringList args = specification.split(':');
    int portNumber = 3333;
    int rotationAngle = 0;
    bool invertx = false;
    bool inverty = false;

    for (int i = 0; i < args.size(); ++i) {
        if (args.at(i).startsWith("udp=")) {
            QString portString = args.at(i).section('=', 1, 1);
            portNumber = portString.toInt();
        } else if (args.at(i).startsWith("tcp=")) {
            QString portString = args.at(i).section('=', 1, 1);
            portNumber = portString.toInt();
            qCWarning(lcTuioHandler) << "TCP is not yet supported. Falling back to UDP on " << portNumber;
        } else if (args.at(i) == "invertx") {
            invertx = true;
        } else if (args.at(i) == "inverty") {
            inverty = true;
        } else if (args.at(i).startsWith("rotate=")) {
            QString rotateArg = args.at(i).section('=', 1, 1);
            int argValue = rotateArg.toInt();
            switch (argValue) {
            case 90:
            case 180:
            case 270:
                rotationAngle = argValue;
                break;
            default:
                break;
            }
        }
    }

    if (rotationAngle)
        m_transform = QTransform::fromTranslate(0.5, 0.5).rotate(rotationAngle).translate(-0.5, -0.5);

    if (invertx)
        m_transform *= QTransform::fromTranslate(0.5, 0.5).scale(-1.0, 1.0).translate(-0.5, -0.5);

    if (inverty)
        m_transform *= QTransform::fromTranslate(0.5, 0.5).scale(1.0, -1.0).translate(-0.5, -0.5);

    // not leaked, QPointingDevice cleans up registered devices itself
    // TODO register each device based on SOURCE, not just an all-purpose generic touchscreen
    // TODO define seats when multiple connections occur
    m_device = new QPointingDevice(QLatin1String("TUIO"), 1, QInputDevice::DeviceType::TouchScreen,
                                   QPointingDevice::PointerType::Finger,
                                   QInputDevice::Capability::Position |
                                   QInputDevice::Capability::Area |
                                   QInputDevice::Capability::Velocity |
                                   QInputDevice::Capability::NormalizedPosition,
                                   16, 0);
    QWindowSystemInterface::registerInputDevice(m_device);

    if (!m_socket.bind(QHostAddress::Any, portNumber)) {
        qCWarning(lcTuioHandler) << "Failed to bind TUIO socket: " << m_socket.errorString();
        return;
    }

    connect(&m_socket, &QUdpSocket::readyRead, this, &QTuioHandler::processPackets);
}